

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O2

Vec_Int_t * Fra_ClauSaveInputVars(Aig_Man_t *pMan,Cnf_Dat_t *pCnf,int nStarting)

{
  Vec_Int_t *p;
  void *pvVar1;
  int i;
  
  p = Vec_IntAlloc(pMan->nObjs[2] - nStarting);
  for (i = 0; i < pMan->vCis->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(pMan->vCis,i);
    if (nStarting <= i) {
      Vec_IntPush(p,pCnf->pVarNums[*(int *)((long)pvVar1 + 0x24)]);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Fra_ClauSaveInputVars( Aig_Man_t * pMan, Cnf_Dat_t * pCnf, int nStarting )
{
    Vec_Int_t * vVars;
    Aig_Obj_t * pObj;
    int i;
    vVars = Vec_IntAlloc( Aig_ManCiNum(pMan) - nStarting );
    Aig_ManForEachCi( pMan, pObj, i )
    {
        if ( i < nStarting )
            continue;
        Vec_IntPush( vVars, pCnf->pVarNums[pObj->Id] );
    }
    return vVars;
}